

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowAggFinal(WindowCodeArg *p,int bFin)

{
  Window *pWVar1;
  ExprList *pEVar2;
  Vdbe *p_00;
  int p2;
  Window *pWVar3;
  
  pWVar1 = p->pMWin;
  p_00 = sqlite3GetVdbe(p->pParse);
  for (pWVar3 = pWVar1; pWVar3 != (Window *)0x0; pWVar3 = pWVar3->pNextWin) {
    if (((pWVar1->regStartRowid == 0) && ((pWVar3->pWFunc->funcFlags & 0x1000) != 0)) &&
       (pWVar3->eStart != '[')) {
      sqlite3VdbeAddOp2(p_00,0x4b,0,pWVar3->regResult);
      sqlite3VdbeAddOp1(p_00,0x20,pWVar3->csrApp);
      sqlite3VdbeAddOp3(p_00,0x5e,pWVar3->csrApp,0,pWVar3->regResult);
      sqlite3VdbeJumpHere(p_00,p_00->nOp + -2);
    }
    else if (pWVar3->regApp == 0) {
      pEVar2 = (pWVar3->pOwner->x).pList;
      if (pEVar2 == (ExprList *)0x0) {
        p2 = 0;
      }
      else {
        p2 = pEVar2->nExpr;
      }
      if (bFin == 0) {
        sqlite3VdbeAddOp3(p_00,0xa4,pWVar3->regAccum,p2,pWVar3->regResult);
        sqlite3VdbeAppendP4(p_00,pWVar3->pWFunc,-7);
      }
      else {
        sqlite3VdbeAddOp2(p_00,0xa5,pWVar3->regAccum,p2);
        sqlite3VdbeAppendP4(p_00,pWVar3->pWFunc,-7);
        sqlite3VdbeAddOp2(p_00,0x50,pWVar3->regAccum,pWVar3->regResult);
        sqlite3VdbeAddOp2(p_00,0x4b,0,pWVar3->regAccum);
      }
    }
  }
  return;
}

Assistant:

static void windowAggFinal(WindowCodeArg *p, int bFin){
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( pMWin->regStartRowid==0
     && (pWin->pWFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
    }else if( pWin->regApp ){
      assert( pMWin->regStartRowid==0 );
    }else{
      int nArg = windowArgCount(pWin);
      if( bFin ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, nArg);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue,pWin->regAccum,nArg,pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
      }
    }
  }
}